

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O1

void __thiscall SetWriter_read_Test::~SetWriter_read_Test(SetWriter_read_Test *this)

{
  pointer puVar1;
  
  (this->super_SetWriter).super_Test._vptr_Test = (_func_int **)&PTR__SetWriter_001971c0;
  pstore::serialize::archive::vector_writer::~vector_writer(&(this->super_SetWriter).writer_);
  puVar1 = (this->super_SetWriter).bytes_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->super_SetWriter).bytes_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (SetWriter, read) {
    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    auto actual = pstore::serialize::read<std::set<int>> (archive);
    static_assert (std::is_same<decltype (actual), std::set<int>>::value,
                   "expected return type of serialize::read<std::set<int>> to be std::set<int>");
    EXPECT_EQ (set_, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}